

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
DeleteSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,int start,int num)

{
  LogMessage *pLVar1;
  int index;
  int iVar2;
  LogFinisher local_d9;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x8a1);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (num < 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x8a2);
    pLVar1 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if ((this->super_RepeatedPtrFieldBase).current_size_ < num + start) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x8a3);
    pLVar1 = internal::LogMessage::operator<<(&local_d8,"CHECK failed: (start + num) <= (size()): ")
    ;
    internal::LogFinisher::operator=(&local_d9,pLVar1);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  index = start;
  iVar2 = num;
  if (0 < num) {
    do {
      internal::RepeatedPtrFieldBase::
      Delete<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase,index);
      iVar2 = iVar2 + -1;
      index = index + 1;
    } while (iVar2 != 0);
  }
  ExtractSubrangeInternal(this,start,num,0);
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::DeleteSubrange(int start, int num) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());
  for (int i = 0; i < num; ++i) {
    RepeatedPtrFieldBase::Delete<TypeHandler>(start + i);
  }
  ExtractSubrange(start, num, NULL);
}